

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::mat4::homogeneous::perspective
                 (mat4 *__return_storage_ptr__,float_t fovy,float_t aspect,float_t zNear,
                 float_t zFar)

{
  float fVar1;
  float fVar2;
  
  if (fovy <= 0.0) {
    __assert_fail("fovy > float_t(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                  ,0x341,
                  "static mat4 dja::mat4::homogeneous::perspective(float_t, float_t, float_t, float_t)"
                 );
  }
  if (aspect <= 0.0) {
    __assert_fail("aspect > float_t(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                  ,0x342,
                  "static mat4 dja::mat4::homogeneous::perspective(float_t, float_t, float_t, float_t)"
                 );
  }
  if (zNear <= 0.0) {
    __assert_fail("zNear > float_t(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                  ,0x343,
                  "static mat4 dja::mat4::homogeneous::perspective(float_t, float_t, float_t, float_t)"
                 );
  }
  if (zNear < zFar) {
    fVar1 = tanf(fovy * 0.5);
    fVar2 = 1.0 / (zNear - zFar);
    __return_storage_ptr__->m[0].x = 0.0;
    __return_storage_ptr__->m[0].y = (1.0 / fVar1) / aspect;
    __return_storage_ptr__->m[0].z = 0.0;
    __return_storage_ptr__->m[0].w = 0.0;
    __return_storage_ptr__->m[1].x = 0.0;
    __return_storage_ptr__->m[1].y = 0.0;
    __return_storage_ptr__->m[1].z = 1.0 / fVar1;
    __return_storage_ptr__->m[1].w = 0.0;
    __return_storage_ptr__->m[2].x = (zNear + zFar) * fVar2;
    __return_storage_ptr__->m[2].y = 0.0;
    __return_storage_ptr__->m[2].z = 0.0;
    __return_storage_ptr__->m[2].w = (zNear + zNear) * zFar * fVar2;
    __return_storage_ptr__->m[3].x = -1.0;
    __return_storage_ptr__->m[3].y = 0.0;
    __return_storage_ptr__->m[3].z = 0.0;
    __return_storage_ptr__->m[3].w = 0.0;
    return __return_storage_ptr__;
  }
  __assert_fail("zNear < zFar",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/dj_algebra/dj_algebra.h"
                ,0x344,
                "static mat4 dja::mat4::homogeneous::perspective(float_t, float_t, float_t, float_t)"
               );
}

Assistant:

mat4
mat4::homogeneous::perspective(
    float_t fovy,
    float_t aspect,
    float_t zNear,
    float_t zFar
) {
    DJA_ASSERT(fovy > float_t(0));
    DJA_ASSERT(aspect > float_t(0));
    DJA_ASSERT(zNear > float_t(0));
    DJA_ASSERT(zNear < zFar);
    float_t f = float_t(1) / tan(fovy / float_t(2));
    float_t c = float_t(1) / (zNear - zFar);
    float_t a = (zFar + zNear) * c;
    float_t b = float_t(2) * zNear * zFar * c;
#if 0 // Standard OpenGL
    return mat4(f / aspect, 0, 0 , 0,
                0         , f, 0 , 0,
                0         , 0, a , b,
                0         , 0, -1, 0);
#else // XYZ -> OpenGL
    return mat4( 0, f / aspect, 0, 0,
                 0, 0         , f, 0,
                 a, 0         , 0, b,
                -1, 0         , 0, 0);
#endif
}